

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall SpikeEvent::SpikeEvent(SpikeEvent *this,int n_multiplicity,double n_weight)

{
  Clock *this_00;
  double dVar1;
  
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_setWeight_00111a50;
  this->multiplicity = 1;
  this->weight = 1.0;
  (this->super_Event).type = Spike;
  this_00 = Clock::getInstance();
  dVar1 = Clock::getCurrentTime(this_00);
  (this->super_Event).eventTime = dVar1;
  this->multiplicity = n_multiplicity;
  this->weight = n_weight;
  return;
}

Assistant:

SpikeEvent(int n_multiplicity, double n_weight) {
        type = EventType::Spike;
        eventTime = Clock::getInstance()->getCurrentTime();
        multiplicity = n_multiplicity;
        weight = n_weight;
    }